

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall
cplus::socket::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  SocketException *pSVar2;
  int *piVar3;
  char *__cp;
  Int local_218;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  String local_1b8;
  String local_1a0;
  String local_188;
  undefined1 local_169;
  Long local_168;
  String local_158;
  allocator local_139;
  string local_138 [32];
  String local_118;
  undefined1 local_f9;
  Long local_f8;
  String local_e8;
  allocator local_c9;
  string local_c8 [32];
  String local_a8;
  undefined1 local_89;
  Int local_88;
  String local_78;
  allocator local_49;
  string local_48 [32];
  String local_28;
  Socket *local_10;
  Socket *this_local;
  
  local_10 = this;
  iVar1 = ::socket(2,1,6);
  this->socket = iVar1;
  if (this->socket < 0) {
    local_89 = 1;
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Create Socket Failed!: ",&local_49);
    piVar3 = __errno_location();
    lang::Int::Int(&local_88,*piVar3);
    lang::Int::toString(&local_78,&local_88);
    lang::operator+(&local_28,(string *)local_48,&local_78);
    SocketException::SocketException(pSVar2,&local_28);
    local_89 = 0;
    __cxa_throw(pSVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  iVar1 = bind(this->socket,(sockaddr *)&this->local_addr,0x10);
  if (iVar1 != 0) {
    local_f9 = 1;
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Client Bind Port Failed!: ",&local_c9);
    piVar3 = __errno_location();
    lang::Long::Long(&local_f8,(long)*piVar3);
    lang::Long::toString(&local_e8,&local_f8);
    lang::operator+(&local_a8,(string *)local_c8,&local_e8);
    SocketException::SocketException(pSVar2,&local_a8);
    local_f9 = 0;
    __cxa_throw(pSVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  __cp = lang::String::c_str(&this->address);
  iVar1 = inet_aton(__cp,(in_addr *)&(this->addr).sin_addr);
  if (iVar1 == 0) {
    local_169 = 1;
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Server IP Address Error!: ",&local_139);
    piVar3 = __errno_location();
    lang::Long::Long(&local_168,(long)*piVar3);
    lang::Long::toString(&local_158,&local_168);
    lang::operator+(&local_118,(string *)local_138,&local_158);
    SocketException::SocketException(pSVar2,&local_118);
    local_169 = 0;
    __cxa_throw(pSVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  iVar1 = ::connect(this->socket,(sockaddr *)&this->addr,0x10);
  if (iVar1 < 0) {
    pSVar2 = (SocketException *)__cxa_allocate_exception(0x838);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"Can Not Connect To ",&local_1d9);
    lang::operator+(&local_1b8,(string *)local_1d8,&this->address);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,", error code: ",&local_201);
    lang::String::operator+(&local_1a0,&local_1b8,(string *)local_200);
    piVar3 = __errno_location();
    lang::Int::Int(&local_218,*piVar3);
    lang::operator+(&local_188,&local_1a0,&local_218);
    SocketException::SocketException(pSVar2,&local_188);
    __cxa_throw(pSVar2,&SocketException::typeinfo,SocketException::~SocketException);
  }
  return iVar1;
}

Assistant:

void Socket::connect() {
			//创建用于internet的流协议(TCP)socket,用client_socket代表客户机socket
			socket = ::socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (socket < 0) {
				throw SocketException("Create Socket Failed!: " + lang::Int(errno).toString());
			}
			//把客户机的socket和客户机的socket地址结构联系起来
			if (::bind(socket, (struct sockaddr *) &local_addr, sizeof(local_addr))) {
				throw SocketException(
						"Client Bind Port Failed!: " + lang::Long(errno).toString());
			}
			
			if (inet_aton(address.c_str(), &addr.sin_addr) == 0) //服务器的IP地址来自程序的参数
			{
				throw SocketException(
						"Server IP Address Error!: " + lang::Long(errno).toString());
			}
			//向服务器发起连接,连接成功后client_socket代表了客户机和服务器的一个socket连接
			if (::connect(socket, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
				throw SocketException("Can Not Connect To " + address + ", error code: " +
				                      lang::Int(errno));
			}
		}